

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O0

double TestSpectra::CH3T_spectrum(double xMin,double xMax)

{
  value_type vVar1;
  initializer_list<double> __l;
  pointer pdVar2;
  ostream *poVar3;
  RandomGen *pRVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> local_c8;
  double local_b0;
  double FuncValue;
  double x;
  double B;
  allocator<double> local_81;
  double local_80;
  double local_78;
  undefined8 local_70;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> xyTry;
  double yMax;
  double qValue;
  double ZZ;
  double aa;
  double m_e;
  double xMax_local;
  double xMin_local;
  
  m_e = xMax;
  if (18.5898 < xMax) {
    m_e = 18.5898;
  }
  xMax_local = xMin;
  if (xMin < 0.0) {
    xMax_local = 0.0;
  }
  if ((((xMax_local != 0.0) || (NAN(xMax_local))) || (m_e != 18.5898)) || (NAN(m_e))) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"WARNING: Recommended energy range is 0 to ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,18.5898);
    poVar3 = std::operator<<(poVar3," keV");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4164fb1800000000;
  pRVar4 = RandomGen::rndm();
  dVar6 = RandomGen::rand_uniform(pRVar4);
  pdVar2 = xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  local_80 = (m_e - xMax_local) * dVar6 + xMax_local;
  pRVar4 = RandomGen::rndm();
  local_78 = RandomGen::rand_uniform(pRVar4);
  local_78 = (double)pdVar2 * local_78;
  local_70 = 0x3ff0000000000000;
  local_68 = &local_80;
  local_60 = 3;
  std::allocator<double>::allocator(&local_81);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,__l,&local_81);
  std::allocator<double>::~allocator(&local_81);
  while (pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_58,2), 0.0 < *pvVar5)
  {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar7 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar6 = sqrt(dVar6 * dVar7 + (*pvVar5 + *pvVar5) * 510.9989461);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    x = dVar6 / (*pvVar5 + 510.9989461);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar7 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar7 = sqrt(dVar7 * dVar8 + (*pvVar5 + *pvVar5) * 510.9989461);
    FuncValue = ((dVar6 + 510.9989461) * 0.09170123685302745) / dVar7;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar8 = sqrt((*pvVar5 + *pvVar5) * 510.9989461);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar7 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar6 = dVar8 * (dVar6 + 510.9989461) * (18.5898 - dVar7) * (18.5898 - *pvVar5) * FuncValue;
    dVar7 = exp(-FuncValue);
    local_b0 = dVar6 * (1.0 / (1.0 - dVar7)) * (x * -0.001427 + 1.002037);
    pRVar4 = RandomGen::rndm();
    pdVar2 = xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,0);
    dVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,1);
    RandomGen::VonNeumann(&local_c8,pRVar4,xMax_local,m_e,0.0,(double)pdVar2,dVar6,*pvVar5,local_b0)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_58,&local_c8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_c8);
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_58,0);
  vVar1 = *pvVar5;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  return vVar1;
}

Assistant:

double TestSpectra::CH3T_spectrum(double xMin, double xMax) {
  double m_e = ElectronRestMassEnergy;  // e- rest mass-energy [keV]
  double aa = 0.0072973525664;          // fine structure constant
  double ZZ = 2.;
  double qValue = 18.5898;  // tritium beta decay endpoint [keV]

  if (xMax > qValue) xMax = qValue;
  if (xMin < 0.) xMin = 0.;
  if (xMin != 0. || xMax != qValue)
    cerr << "WARNING: Recommended energy range is 0 to " << qValue << " keV"
         << endl;
  double yMax = 1.1e7;  // top of the beta decay E histogram
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double B =
        sqrt(xyTry[0] * xyTry[0] + 2. * xyTry[0] * m_e) / (xyTry[0] + m_e);
    double x = (2. * M_PI * ZZ * aa) * (xyTry[0] + m_e) /
               sqrt(xyTry[0] * xyTry[0] + 2. * xyTry[0] * m_e);
    double FuncValue = (sqrt(2. * xyTry[0] * m_e) * (xyTry[0] + m_e) *
                        (qValue - xyTry[0]) * (qValue - xyTry[0]) * x *
                        (1. / (1. - exp(-x))) * (1.002037 - 0.001427 * (B)));
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, 0., yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}